

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O0

optional<cmStandardLevel> __thiscall
anon_unknown.dwarf_886731::StandardLevelComputer::CompileFeatureStandardLevel
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmValue cVar1;
  bool bVar2;
  string *psVar3;
  const_reference b;
  undefined8 extraout_RDX;
  optional<cmStandardLevel> oVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  cmStandardLevel local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  cmList props;
  string local_80;
  cmValue local_60;
  cmValue prop;
  size_t i;
  string prefix;
  string *feature_local;
  cmMakefile *makefile_local;
  StandardLevelComputer *this_local;
  optional<cmStandardLevel> maxLevel;
  
  prefix.field_2._8_8_ = feature;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&>
            ((string *)&i,(char (*) [7])0x112a736,&this->Language);
  std::optional<cmStandardLevel>::optional((optional<cmStandardLevel> *)&this_local);
  for (prop.Value = (string *)0x0; cVar1.Value = prop.Value,
      psVar3 = (string *)std::vector<int,_std::allocator<int>_>::size(&this->Levels),
      cVar1.Value < psVar3; prop.Value = (string *)&(prop.Value)->field_0x1) {
    b = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&this->LevelsAsStrings,(size_type)prop.Value);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string_const&,char_const(&)[18]>
              (&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,b,
               (char (*) [18])0x115aa46);
    local_60 = cmMakefile::GetDefinition(makefile,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    bVar2 = cmValue::operator_cast_to_bool(&local_60);
    if (bVar2) {
      local_e0 = &local_d8;
      psVar3 = cmValue::operator*[abi_cxx11_(&local_60);
      std::__cxx11::string::string((string *)&local_d8,(string *)psVar3);
      local_b8 = &local_d8;
      local_b0 = 1;
      init._M_len = 1;
      init._M_array = local_b8;
      cmList::cmList((cmList *)local_a8,init);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8;
      do {
        local_118 = local_118 + -1;
        std::__cxx11::string::~string((string *)local_118);
      } while (local_118 != &local_d8);
      bVar2 = ::cm::
              contains<cmList,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((cmList *)local_a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         prefix.field_2._8_8_);
      if (bVar2) {
        cmStandardLevel::cmStandardLevel(&local_e8,(size_t)prop.Value);
        std::optional<cmStandardLevel>::operator=
                  ((optional<cmStandardLevel> *)&this_local,&local_e8);
      }
      cmList::~cmList((cmList *)local_a8);
    }
  }
  std::__cxx11::string::~string((string *)&i);
  oVar4.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  oVar4.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._M_engaged =
       (bool)maxLevel.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
             super__Optional_payload_base<cmStandardLevel>._M_payload._M_value.index_._0_1_;
  oVar4.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._M_payload =
       (_Storage<cmStandardLevel,_true>)this_local;
  return (optional<cmStandardLevel>)
         oVar4.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
         super__Optional_payload_base<cmStandardLevel>;
}

Assistant:

cm::optional<cmStandardLevel> CompileFeatureStandardLevel(
    cmMakefile* makefile, std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    cm::optional<cmStandardLevel> maxLevel;
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        cmList props{ *prop };
        if (cm::contains(props, feature)) {
          maxLevel = cmStandardLevel(i);
        }
      }
    }
    return maxLevel;
  }